

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_WriteBlif(Abc_Ntk_t *pNtk,char *FileName,int fWriteLatches,int fBb2Wb,int fSeq)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  Abc_Ntk_t *pNtk_00;
  int local_3c;
  int i;
  Abc_Ntk_t *pNtkTemp;
  FILE *pFile;
  int fSeq_local;
  int fBb2Wb_local;
  int fWriteLatches_local;
  char *FileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsNetlist(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBlif.c"
                  ,0x59,"void Io_WriteBlif(Abc_Ntk_t *, char *, int, int, int)");
  }
  __stream = fopen(FileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteBlif(): Cannot open the output file.\n");
  }
  else {
    pcVar1 = pNtk->pName;
    pcVar3 = Extra_TimeStamp();
    fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
    Io_NtkWrite((FILE *)__stream,pNtk,fWriteLatches,fBb2Wb,fSeq);
    iVar2 = Abc_NtkBlackboxNum(pNtk);
    if ((0 < iVar2) || (iVar2 = Abc_NtkWhiteboxNum(pNtk), 0 < iVar2)) {
      for (local_3c = 0; iVar2 = Vec_PtrSize(pNtk->pDesign->vModules), local_3c < iVar2;
          local_3c = local_3c + 1) {
        pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pNtk->pDesign->vModules,local_3c);
        if (pNtk_00 != pNtk) {
          fprintf(__stream,"\n\n");
          Io_NtkWrite((FILE *)__stream,pNtk_00,fWriteLatches,fBb2Wb,fSeq);
        }
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Io_WriteBlif( Abc_Ntk_t * pNtk, char * FileName, int fWriteLatches, int fBb2Wb, int fSeq )
{
    FILE * pFile;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the file
    pFile = fopen( FileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBlif(): Cannot open the output file.\n" );
        return;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the master network
    Io_NtkWrite( pFile, pNtk, fWriteLatches, fBb2Wb, fSeq );
    // make sure there is no logic hierarchy
//    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    // write the hierarchy if present
    if ( Abc_NtkBlackboxNum(pNtk) > 0 || Abc_NtkWhiteboxNum(pNtk) > 0 )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            fprintf( pFile, "\n\n" );
            Io_NtkWrite( pFile, pNtkTemp, fWriteLatches, fBb2Wb, fSeq );
        }
    }
    fclose( pFile );
}